

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::DoubleAPFloat::makeSmallestNormalized(DoubleAPFloat *this,bool Neg)

{
  type pAVar1;
  APInt local_48;
  APFloat local_38;
  byte local_11;
  DoubleAPFloat *pDStack_10;
  bool Neg_local;
  DoubleAPFloat *this_local;
  
  local_11 = Neg;
  pDStack_10 = this;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x1092,"void llvm::detail::DoubleAPFloat::makeSmallestNormalized(bool)");
  }
  APInt::APInt(&local_48,0x40,0x360000000000000,false);
  APFloat::APFloat(&local_38,(fltSemantics *)semIEEEdouble,&local_48);
  pAVar1 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&this->Floats,0);
  APFloat::operator=(pAVar1,&local_38);
  APFloat::~APFloat(&local_38);
  APInt::~APInt(&local_48);
  if ((local_11 & 1) != 0) {
    pAVar1 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&this->Floats,0);
    APFloat::changeSign(pAVar1);
  }
  pAVar1 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&this->Floats,1);
  APFloat::makeZero(pAVar1,false);
  return;
}

Assistant:

void DoubleAPFloat::makeSmallestNormalized(bool Neg) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  Floats[0] = APFloat(semIEEEdouble, APInt(64, 0x0360000000000000ull));
  if (Neg)
    Floats[0].changeSign();
  Floats[1].makeZero(/* Neg = */ false);
}